

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cc
# Opt level: O3

bool __thiscall
google::protobuf::compiler::Parser::ParseReservedNumbers
          (Parser *this,DescriptorProto *message,LocationRecorder *parent_location)

{
  Tokenizer *pTVar1;
  bool bVar2;
  bool bVar3;
  Message *descriptor;
  char *pcVar4;
  int iVar5;
  int iVar6;
  string_view text;
  string_view text_00;
  string_view text_01;
  string_view text_02;
  ErrorMaker error;
  int start;
  LocationRecorder start_location;
  Token start_token;
  LocationRecorder location;
  int local_b8;
  int local_b4;
  LocationRecorder *local_b0;
  LocationRecorder local_a8;
  RepeatedPtrFieldBase *local_90;
  DescriptorProto *local_88;
  undefined1 local_80 [8];
  _Alloc_hider local_78;
  size_type local_70;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_68;
  undefined8 local_58;
  ColumnNumber local_50;
  LocationRecorder local_48;
  
  local_90 = &(message->field_0)._impl_.reserved_range_.super_RepeatedPtrFieldBase;
  bVar3 = true;
  local_b0 = parent_location;
  local_88 = message;
  do {
    LocationRecorder::LocationRecorder(&local_48,local_b0,*(int *)((long)&local_88->field_0 + 0xa0))
    ;
    descriptor = (Message *)
                 internal::RepeatedPtrFieldBase::AddMessageLite
                           (local_90,Arena::
                                     DefaultConstruct<google::protobuf::DescriptorProto_ReservedRange>
                           );
    LocationRecorder::RecordLegacyLocation(&local_48,descriptor,NUMBER);
    local_78._M_p = (pointer)&local_68;
    local_70 = 0;
    local_68._M_local_buf[0] = '\0';
    LocationRecorder::LocationRecorder(&local_a8,&local_48,1);
    pTVar1 = this->input_;
    local_80._0_4_ = (pTVar1->current_).type;
    std::__cxx11::string::_M_assign((string *)&local_78);
    local_50 = (pTVar1->current_).end_column;
    local_58._0_4_ = (pTVar1->current_).line;
    local_58._4_4_ = (pTVar1->current_).column;
    pcVar4 = "Expected field number range.";
    if (bVar3) {
      pcVar4 = "Expected field name or number range.";
    }
    error.func_ = (_func_string_void_ptr *)0x0;
    error.field_0.error_ = pcVar4;
    bVar2 = ConsumeInteger(this,&local_b4,error);
    LocationRecorder::~LocationRecorder(&local_a8);
    if (bVar2) {
      text._M_str = "to";
      text._M_len = 2;
      bVar2 = TryConsume(this,text);
      if (bVar2) {
        LocationRecorder::LocationRecorder(&local_a8,&local_48,2);
        text_00._M_str = "max";
        text_00._M_len = 3;
        bVar2 = TryConsume(this,text_00);
        iVar6 = -2;
        if ((!bVar2) &&
           (bVar2 = ConsumeInteger(this,&local_b8,(ErrorMaker)ZEXT816(0x335f30)), iVar6 = local_b8,
           !bVar2)) {
          LocationRecorder::~LocationRecorder(&local_a8);
          bVar2 = false;
          goto LAB_001d40ef;
        }
        LocationRecorder::~LocationRecorder(&local_a8);
        iVar5 = local_b4;
      }
      else {
        LocationRecorder::LocationRecorder(&local_a8,&local_48,2);
        LocationRecorder::StartAt(&local_a8,(Token *)local_80);
        LocationRecorder::EndAt(&local_a8,(Token *)local_80);
        iVar6 = local_b4;
        LocationRecorder::~LocationRecorder(&local_a8);
        iVar5 = iVar6;
      }
      local_b8 = iVar6 + 1;
      *(int *)&descriptor[1].super_MessageLite._internal_metadata_.ptr_ = iVar5;
      *(int *)((long)&descriptor[1].super_MessageLite._internal_metadata_.ptr_ + 4) = local_b8;
      *(byte *)&descriptor[1].super_MessageLite._vptr_MessageLite =
           *(byte *)&descriptor[1].super_MessageLite._vptr_MessageLite | 3;
      bVar2 = true;
      bVar3 = false;
    }
    else {
      bVar2 = false;
    }
LAB_001d40ef:
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_78._M_p != &local_68) {
      operator_delete(local_78._M_p,
                      CONCAT71(local_68._M_allocated_capacity._1_7_,local_68._M_local_buf[0]) + 1);
    }
    LocationRecorder::~LocationRecorder(&local_48);
    if (!bVar2) {
      return false;
    }
    text_01._M_str = ",";
    text_01._M_len = 1;
    bVar2 = TryConsume(this,text_01);
    if (!bVar2) {
      text_02._M_str = ";";
      text_02._M_len = 1;
      bVar3 = ConsumeEndOfDeclaration(this,text_02,local_b0);
      return bVar3;
    }
  } while( true );
}

Assistant:

bool Parser::ParseReservedNumbers(DescriptorProto* message,
                                  const LocationRecorder& parent_location) {
  bool first = true;
  do {
    LocationRecorder location(parent_location, message->reserved_range_size());

    DescriptorProto::ReservedRange* range = message->add_reserved_range();
    location.RecordLegacyLocation(range,
                                  DescriptorPool::ErrorCollector::NUMBER);
    int start, end;
    io::Tokenizer::Token start_token;
    {
      LocationRecorder start_location(
          location, DescriptorProto::ReservedRange::kStartFieldNumber);
      start_token = input_->current();
      DO(ConsumeInteger(&start, (first ? "Expected field name or number range."
                                       : "Expected field number range.")));
    }

    if (TryConsume("to")) {
      LocationRecorder end_location(
          location, DescriptorProto::ReservedRange::kEndFieldNumber);
      if (TryConsume("max")) {
        // Set to the sentinel value - 1 since we increment the value below.
        // The actual value of the end of the range should be set with
        // AdjustExtensionRangesWithMaxEndNumber.
        end = kMaxRangeSentinel - 1;
      } else {
        DO(ConsumeInteger(&end, "Expected integer."));
      }
    } else {
      LocationRecorder end_location(
          location, DescriptorProto::ReservedRange::kEndFieldNumber);
      end_location.StartAt(start_token);
      end_location.EndAt(start_token);
      end = start;
    }

    // Users like to specify inclusive ranges, but in code we like the end
    // number to be exclusive.
    ++end;

    range->set_start(start);
    range->set_end(end);
    first = false;
  } while (TryConsume(","));

  DO(ConsumeEndOfDeclaration(";", &parent_location));
  return true;
}